

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unify_const_pass.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::anon_unknown_8::ResultIdTrie::GetLookUpKeys
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ResultIdTrie *this,Instruction *inst)

{
  Instruction *this_00;
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  const_iterator local_50;
  reference local_48;
  Operand *operand;
  const_iterator __end3;
  const_iterator __begin3;
  Instruction *__range3;
  Instruction *local_20;
  Instruction *inst_local;
  ResultIdTrie *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *keys;
  
  __range3._7_1_ = 0;
  local_20 = inst;
  inst_local = (Instruction *)this;
  this_local = (ResultIdTrie *)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  __range3._0_4_ = opt::Instruction::opcode(local_20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (__return_storage_ptr__,(value_type *)&__range3);
  this_00 = local_20;
  __end3 = opt::Instruction::begin(local_20);
  operand = (Operand *)opt::Instruction::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
                                     *)&operand), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
               ::operator*(&__end3);
    if (local_48->type != SPV_OPERAND_TYPE_RESULT_ID) {
      local_58._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_50,&local_58);
      __first = utils::SmallVector<unsigned_int,_2UL>::cbegin(&local_48->words);
      __last = utils::SmallVector<unsigned_int,_2UL>::cend(&local_48->words);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int_const*,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                 local_50,__first,__last);
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
    ::operator++(&__end3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> GetLookUpKeys(const Instruction& inst) {
    std::vector<uint32_t> keys;
    // Need to use the opcode, otherwise there might be a conflict with the
    // following case when <op>'s binary value equals xx's id:
    //  OpSpecConstantOp tt <op> yy zz
    //  OpSpecConstantComposite tt xx yy zz;
    keys.push_back(static_cast<uint32_t>(inst.opcode()));
    for (const auto& operand : inst) {
      if (operand.type == SPV_OPERAND_TYPE_RESULT_ID) continue;
      keys.insert(keys.end(), operand.words.cbegin(), operand.words.cend());
    }
    return keys;
  }